

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logical.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     or_<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (modify_t<unsigned_short> destination,read_t<unsigned_short> source,Context *context)

{
  Context *context_local;
  read_t<unsigned_short> source_local;
  modify_t<unsigned_short> destination_local;
  
  *destination = *destination | source;
  Flags::set_from<(InstructionSet::x86::Flag)3,(InstructionSet::x86::Flag)0>(&context->flags,0);
  Flags::
  set_from<unsigned_short,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)8>
            (&context->flags,*destination);
  return;
}

Assistant:

void or_(
	modify_t<IntT> destination,
	read_t<IntT> source,
	ContextT &context
) {
	/*
		DEST ← DEST OR SRC;
	*/
	/*
		The OF and CF flags are cleared; the SF, ZF, and PF flags are set according to the result.
		The state of the AF flag is undefined.
	*/
	destination |= source;

	context.flags.template set_from<Flag::Overflow, Flag::Carry>(0);
	context.flags.template set_from<IntT, Flag::Zero, Flag::Sign, Flag::ParityOdd>(destination);
}